

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

void __thiscall
BCLog::Logger::LogPrintStr_
          (Logger *this,string_view str,string_view logging_function,string_view source_file,
          int source_line,LogFlags category,Level level)

{
  list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_> *__position;
  __int_type _Var1;
  iterator __position_00;
  string_view threadname;
  undefined8 uVar2;
  undefined8 uVar3;
  time_point now;
  seconds mocktime;
  FILE *__stream;
  BCLog *this_00;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  __int_type _Var5;
  string_view str_00;
  BufferedLog buf;
  string str_prefixed;
  undefined1 local_100 [16];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  int local_70;
  LogFlags local_68;
  Level local_60;
  string local_58;
  long local_38;
  
  str_00._M_str = (char *)logging_function._M_len;
  str_00._M_len = str._M_str;
  this_00 = (BCLog *)str._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  LogEscapeMessage_abi_cxx11_(&local_58,this_00,str_00);
  _Var1 = (this->m_started_new_line)._M_base._M_i;
  if (this_00 == (BCLog *)0x0) {
    _Var5 = false;
  }
  else {
    _Var5 = (str_00._M_len + -1)[(long)this_00] == '\n';
  }
  LOCK();
  (this->m_started_new_line)._M_base._M_i = _Var5;
  UNLOCK();
  if (this->m_buffering == true) {
    if ((_Var1 & 1U) == 0) {
      if ((this->m_msgs_before_open).
          super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>.
          _M_impl._M_node.super__List_node_base._M_next !=
          (_List_node_base *)&this->m_msgs_before_open) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((this->m_msgs_before_open).
                    super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
                    ._M_impl._M_node.super__List_node_base._M_prev + 2),local_58._M_dataplus._M_p,
                   local_58._M_string_length);
        this->m_cur_buffer_memusage = this->m_cur_buffer_memusage + local_58._M_string_length;
        goto LAB_001d6358;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (&local_58,0,0,"[...] ",6);
    }
    local_100._0_8_ = std::chrono::_V2::system_clock::now();
    local_100._8_8_ = GetMockTime();
    local_f0._M_p = (pointer)&local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    local_d0._M_p = (pointer)&local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,logging_function._M_str,
               str_00._M_str + (long)logging_function._M_str);
    local_b0._M_p = (pointer)&local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,source_file._M_str,source_file._M_str + source_file._M_len);
    util::ThreadGetInternalName_abi_cxx11_();
    local_68 = category;
    local_60 = level;
    this->m_cur_buffer_memusage =
         local_e8 + local_c8 + local_a8 + local_88 + this->m_cur_buffer_memusage + 0xd0;
    __position = &this->m_msgs_before_open;
    local_70 = source_line;
    std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::
    _M_insert<BCLog::Logger::BufferedLog>(__position,(iterator)__position,(BufferedLog *)local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p != &local_c0) {
      operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
    }
    while (this->m_max_buffer_memusage < this->m_cur_buffer_memusage) {
      __position_00._M_node =
           (__position->
           super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
           )._M_impl._M_node.super__List_node_base._M_next;
      if (__position_00._M_node == (_List_node_base *)__position) {
        this->m_cur_buffer_memusage = 0;
        break;
      }
      this->m_cur_buffer_memusage =
           (this->m_cur_buffer_memusage -
           ((long)&(__position_00._M_node[8]._M_prev)->_M_next +
           (long)&(__position_00._M_node[6]._M_prev)->_M_next +
           (long)&(__position_00._M_node[4]._M_prev)->_M_next +
           (long)&(__position_00._M_node[2]._M_prev)->_M_next)) - 0xd0;
      std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::
      _M_erase(__position,__position_00);
      this->m_buffer_lines_discarded = this->m_buffer_lines_discarded + 1;
    }
  }
  else {
    if ((_Var1 & 1U) != 0) {
      util::ThreadGetInternalName_abi_cxx11_();
      uVar3 = local_100._8_8_;
      uVar2 = local_100._0_8_;
      now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      mocktime = GetMockTime();
      threadname._M_str = (char *)uVar2;
      threadname._M_len = uVar3;
      FormatLogStrInPlace(this,&local_58,category,level,source_file,source_line,logging_function,
                          threadname,now,mocktime);
      if ((_Alloc_hider *)local_100._0_8_ != &local_f0) {
        operator_delete((void *)local_100._0_8_,(ulong)(local_f0._M_p + 1));
      }
    }
    if (this->m_print_to_console == true) {
      fwrite(local_58._M_dataplus._M_p,1,local_58._M_string_length,_stdout);
      fflush(_stdout);
    }
    p_Var4 = (_List_node_base *)&this->m_print_callbacks;
    while (p_Var4 = (((_List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)&this->m_print_callbacks) {
      if (p_Var4[2]._M_next == (_List_node_base *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001d64f3;
        std::__throw_bad_function_call();
        goto LAB_001d63be;
      }
      (*(code *)p_Var4[2]._M_prev)(p_Var4 + 1,&local_58);
    }
    if (this->m_print_to_file != false) {
      if (this->m_fileout == (FILE *)0x0) {
LAB_001d63be:
        __assert_fail("m_fileout != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/logging.cpp"
                      ,0x1c4,
                      "void BCLog::Logger::LogPrintStr_(std::string_view, std::string_view, std::string_view, int, BCLog::LogFlags, BCLog::Level)"
                     );
      }
      if (((this->m_reopen_file)._M_base._M_i & 1U) != 0) {
        LOCK();
        (this->m_reopen_file)._M_base._M_i = false;
        UNLOCK();
        __stream = fsbridge::fopen((char *)&this->m_file_path,"a");
        if (__stream != (FILE *)0x0) {
          setbuf(__stream,(char *)0x0);
          fclose((FILE *)this->m_fileout);
          this->m_fileout = (FILE *)__stream;
        }
      }
      fwrite(local_58._M_dataplus._M_p,1,local_58._M_string_length,(FILE *)this->m_fileout);
    }
  }
LAB_001d6358:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001d64f3:
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::LogPrintStr_(std::string_view str, std::string_view logging_function, std::string_view source_file, int source_line, BCLog::LogFlags category, BCLog::Level level)
{
    std::string str_prefixed = LogEscapeMessage(str);

    const bool starts_new_line = m_started_new_line;
    m_started_new_line = !str.empty() && str[str.size()-1] == '\n';

    if (m_buffering) {
        if (!starts_new_line) {
            if (!m_msgs_before_open.empty()) {
                m_msgs_before_open.back().str += str_prefixed;
                m_cur_buffer_memusage += str_prefixed.size();
                return;
            } else {
                // unlikely edge case; add a marker that something was trimmed
                str_prefixed.insert(0, "[...] ");
            }
        }

        {
            BufferedLog buf{
                .now=SystemClock::now(),
                .mocktime=GetMockTime(),
                .str=str_prefixed,
                .logging_function=std::string(logging_function),
                .source_file=std::string(source_file),
                .threadname=util::ThreadGetInternalName(),
                .source_line=source_line,
                .category=category,
                .level=level,
            };
            m_cur_buffer_memusage += MemUsage(buf);
            m_msgs_before_open.push_back(std::move(buf));
        }

        while (m_cur_buffer_memusage > m_max_buffer_memusage) {
            if (m_msgs_before_open.empty()) {
                m_cur_buffer_memusage = 0;
                break;
            }
            m_cur_buffer_memusage -= MemUsage(m_msgs_before_open.front());
            m_msgs_before_open.pop_front();
            ++m_buffer_lines_discarded;
        }

        return;
    }

    if (starts_new_line) {
        FormatLogStrInPlace(str_prefixed, category, level, source_file, source_line, logging_function, util::ThreadGetInternalName(), SystemClock::now(), GetMockTime());
    }

    if (m_print_to_console) {
        // print to console
        fwrite(str_prefixed.data(), 1, str_prefixed.size(), stdout);
        fflush(stdout);
    }
    for (const auto& cb : m_print_callbacks) {
        cb(str_prefixed);
    }
    if (m_print_to_file) {
        assert(m_fileout != nullptr);

        // reopen the log file, if requested
        if (m_reopen_file) {
            m_reopen_file = false;
            FILE* new_fileout = fsbridge::fopen(m_file_path, "a");
            if (new_fileout) {
                setbuf(new_fileout, nullptr); // unbuffered
                fclose(m_fileout);
                m_fileout = new_fileout;
            }
        }
        FileWriteStr(str_prefixed, m_fileout);
    }
}